

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_unpacked.c
# Opt level: O3

PHYSFS_Io * UNPK_openRead(void *opaque,char *name)

{
  undefined4 uVar1;
  int iVar2;
  void *pvVar3;
  PHYSFS_Io *pPVar4;
  long *plVar5;
  long lVar6;
  PHYSFS_Io *pPVar7;
  PHYSFS_ErrorCode errcode;
  PHYSFS_Io *pPVar8;
  byte bVar9;
  
  bVar9 = 0;
  pvVar3 = __PHYSFS_DirTreeFind((__PHYSFS_DirTree *)opaque,name);
  if (pvVar3 != (void *)0x0) {
    if (*(int *)((long)pvVar3 + 0x20) == 0) {
      pPVar4 = (PHYSFS_Io *)(*__PHYSFS_AllocatorHooks.Malloc)(0x50);
      if (pPVar4 != (PHYSFS_Io *)0x0) {
        plVar5 = (long *)(*__PHYSFS_AllocatorHooks.Malloc)(0x18);
        if (plVar5 == (long *)0x0) {
          PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
        }
        else {
          lVar6 = (**(code **)(*(long *)((long)opaque + 0x20) + 0x38))();
          *plVar5 = lVar6;
          if (lVar6 != 0) {
            iVar2 = (**(code **)(lVar6 + 0x20))(lVar6,*(undefined8 *)((long)pvVar3 + 0x28));
            if (iVar2 != 0) {
              *(undefined4 *)(plVar5 + 2) = 0;
              plVar5[1] = (long)pvVar3;
              pPVar7 = &UNPK_Io;
              pPVar8 = pPVar4;
              for (lVar6 = 10; lVar6 != 0; lVar6 = lVar6 + -1) {
                uVar1 = *(undefined4 *)&pPVar7->field_0x4;
                pPVar8->version = pPVar7->version;
                *(undefined4 *)&pPVar8->field_0x4 = uVar1;
                pPVar7 = (PHYSFS_Io *)((long)pPVar7 + ((ulong)bVar9 * -2 + 1) * 8);
                pPVar8 = (PHYSFS_Io *)((long)pPVar8 + (ulong)bVar9 * -0x10 + 8);
              }
              pPVar4->opaque = plVar5;
              return pPVar4;
            }
            if (*plVar5 != 0) {
              (**(code **)(*plVar5 + 0x48))();
            }
          }
          (*__PHYSFS_AllocatorHooks.Free)(plVar5);
        }
        (*__PHYSFS_AllocatorHooks.Free)(pPVar4);
        return (PHYSFS_Io *)0x0;
      }
      errcode = PHYSFS_ERR_OUT_OF_MEMORY;
    }
    else {
      errcode = PHYSFS_ERR_NOT_A_FILE;
    }
    PHYSFS_setErrorCode(errcode);
  }
  return (PHYSFS_Io *)0x0;
}

Assistant:

PHYSFS_Io *UNPK_openRead(void *opaque, const char *name)
{
    PHYSFS_Io *retval = NULL;
    UNPKinfo *info = (UNPKinfo *) opaque;
    UNPKfileinfo *finfo = NULL;
    UNPKentry *entry = findEntry(info, name);

    BAIL_IF_ERRPASS(!entry, NULL);
    BAIL_IF(entry->tree.isdir, PHYSFS_ERR_NOT_A_FILE, NULL);

    retval = (PHYSFS_Io *) allocator.Malloc(sizeof (PHYSFS_Io));
    GOTO_IF(!retval, PHYSFS_ERR_OUT_OF_MEMORY, UNPK_openRead_failed);

    finfo = (UNPKfileinfo *) allocator.Malloc(sizeof (UNPKfileinfo));
    GOTO_IF(!finfo, PHYSFS_ERR_OUT_OF_MEMORY, UNPK_openRead_failed);

    finfo->io = info->io->duplicate(info->io);
    GOTO_IF_ERRPASS(!finfo->io, UNPK_openRead_failed);

    if (!finfo->io->seek(finfo->io, entry->startPos))
        goto UNPK_openRead_failed;

    finfo->curPos = 0;
    finfo->entry = entry;

    memcpy(retval, &UNPK_Io, sizeof (*retval));
    retval->opaque = finfo;
    return retval;

UNPK_openRead_failed:
    if (finfo != NULL)
    {
        if (finfo->io != NULL)
            finfo->io->destroy(finfo->io);
        allocator.Free(finfo);
    } /* if */

    if (retval != NULL)
        allocator.Free(retval);

    return NULL;
}